

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,char **loc,char **imp,string *suffix)

{
  bool bVar1;
  char *pcVar2;
  pointer s;
  _Alloc_hider s_00;
  bool bVar3;
  allocator local_f1;
  string *local_f0;
  string mapProp;
  string locProp;
  string impProp;
  string locPropBase;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  string config_upper;
  
  config_upper._M_dataplus._M_p = (pointer)&config_upper.field_2;
  config_upper._M_string_length = 0;
  config_upper.field_2._M_local_buf[0] = '\0';
  local_f0 = suffix;
  if (desired_config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&locPropBase,desired_config);
    std::__cxx11::string::operator=((string *)&config_upper,(string *)&locPropBase);
    std::__cxx11::string::~string((string *)&locPropBase);
  }
  locPropBase._M_dataplus._M_p = (pointer)&locPropBase.field_2;
  locPropBase._M_string_length = 0;
  locPropBase.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&locPropBase);
  std::__cxx11::string::assign((char *)local_f0);
  std::__cxx11::string::append((string *)local_f0);
  mappedConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mappedConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mappedConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&mapProp,"MAP_IMPORTED_CONFIG_",(allocator *)&locProp);
  std::__cxx11::string::append((string *)&mapProp);
  pcVar2 = GetProperty(this,&mapProp);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string((string *)&locProp,pcVar2,(allocator *)&impProp);
    cmSystemTools::ExpandListArgument(&locProp,&mappedConfigs,true);
    std::__cxx11::string::~string((string *)&locProp);
  }
  std::__cxx11::string::~string((string *)&mapProp);
  bVar1 = HasImportLibrary(this);
  s = mappedConfigs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  do {
    bVar3 = true;
    if (*loc != (char *)0x0) {
LAB_0031aa42:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&mappedConfigs);
      std::__cxx11::string::~string((string *)&locPropBase);
      std::__cxx11::string::~string((string *)&config_upper);
      return bVar3;
    }
    pcVar2 = *imp;
    if ((pcVar2 != (char *)0x0) ||
       (s == mappedConfigs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
      if (mappedConfigs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          mappedConfigs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (pcVar2 == (char *)0x0) {
          std::__cxx11::string::string((string *)&mapProp,(string *)&locPropBase);
          std::__cxx11::string::append((string *)&mapProp);
          pcVar2 = GetProperty(this,&mapProp);
          *loc = pcVar2;
          if (bVar1) {
            std::__cxx11::string::string((string *)&locProp,"IMPORTED_IMPLIB",(allocator *)&impProp)
            ;
            std::__cxx11::string::append((string *)&locProp);
            pcVar2 = GetProperty(this,&locProp);
            *imp = pcVar2;
            std::__cxx11::string::~string((string *)&locProp);
          }
          std::__cxx11::string::~string((string *)&mapProp);
          if (*loc != (char *)0x0) goto LAB_0031aa42;
        }
      }
      else if (pcVar2 == (char *)0x0) goto LAB_0031a7a6;
      if (*imp == (char *)0x0) {
        std::__cxx11::string::assign((char *)local_f0);
        pcVar2 = GetProperty(this,&locPropBase);
        *loc = pcVar2;
        if (bVar1) {
          std::__cxx11::string::string((string *)&mapProp,"IMPORTED_IMPLIB",(allocator *)&locProp);
          pcVar2 = GetProperty(this,&mapProp);
          *imp = pcVar2;
          std::__cxx11::string::~string((string *)&mapProp);
          pcVar2 = *loc;
        }
        if ((pcVar2 == (char *)0x0) && (*imp == (char *)0x0)) {
          impProp._M_dataplus._M_p = (pointer)0x0;
          impProp._M_string_length = 0;
          impProp.field_2._M_allocated_capacity = 0;
          std::__cxx11::string::string
                    ((string *)&mapProp,"IMPORTED_CONFIGURATIONS",(allocator *)&locProp);
          pcVar2 = GetProperty(this,&mapProp);
          std::__cxx11::string::~string((string *)&mapProp);
          if (pcVar2 != (char *)0x0) {
            std::__cxx11::string::string((string *)&mapProp,pcVar2,(allocator *)&locProp);
            cmSystemTools::ExpandListArgument
                      (&mapProp,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&impProp,false);
            std::__cxx11::string::~string((string *)&mapProp);
          }
          for (s_00._M_p = impProp._M_dataplus._M_p;
              ((*loc == (char *)0x0 && (*imp == (char *)0x0)) &&
              (s_00._M_p != (pointer)impProp._M_string_length)); s_00._M_p = s_00._M_p + 0x20) {
            std::__cxx11::string::assign((char *)local_f0);
            cmsys::SystemTools::UpperCase(&mapProp,(string *)s_00._M_p);
            std::__cxx11::string::append((string *)local_f0);
            std::__cxx11::string::~string((string *)&mapProp);
            std::__cxx11::string::string((string *)&mapProp,(string *)&locPropBase);
            std::__cxx11::string::append((string *)&mapProp);
            pcVar2 = GetProperty(this,&mapProp);
            *loc = pcVar2;
            if (bVar1) {
              std::__cxx11::string::string((string *)&locProp,"IMPORTED_IMPLIB",&local_f1);
              std::__cxx11::string::append((string *)&locProp);
              pcVar2 = GetProperty(this,&locProp);
              *imp = pcVar2;
              std::__cxx11::string::~string((string *)&locProp);
            }
            std::__cxx11::string::~string((string *)&mapProp);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&impProp);
          if ((*loc == (char *)0x0) && (*imp == (char *)0x0)) {
LAB_0031a7a6:
            bVar3 = this->TargetTypeValue == INTERFACE_LIBRARY;
          }
        }
      }
      goto LAB_0031aa42;
    }
    if (s->_M_string_length == 0) {
      pcVar2 = GetProperty(this,&locPropBase);
      *loc = pcVar2;
      if (bVar1) {
        std::__cxx11::string::string((string *)&mapProp,"IMPORTED_IMPLIB",(allocator *)&locProp);
        pcVar2 = GetProperty(this,&mapProp);
        *imp = pcVar2;
        std::__cxx11::string::~string((string *)&mapProp);
        pcVar2 = *loc;
      }
      if ((pcVar2 != (char *)0x0) || (*imp != (char *)0x0)) {
        std::__cxx11::string::assign((char *)local_f0);
      }
    }
    else {
      cmsys::SystemTools::UpperCase(&mapProp,s);
      std::operator+(&locProp,&locPropBase,"_");
      std::__cxx11::string::append((string *)&locProp);
      pcVar2 = GetProperty(this,&locProp);
      *loc = pcVar2;
      if (bVar1) {
        std::__cxx11::string::string((string *)&impProp,"IMPORTED_IMPLIB_",&local_f1);
        std::__cxx11::string::append((string *)&impProp);
        pcVar2 = GetProperty(this,&impProp);
        *imp = pcVar2;
        std::__cxx11::string::~string((string *)&impProp);
        pcVar2 = *loc;
      }
      if ((pcVar2 != (char *)0x0) || (*imp != (char *)0x0)) {
        std::__cxx11::string::assign((char *)local_f0);
        std::__cxx11::string::append((string *)local_f0);
      }
      std::__cxx11::string::~string((string *)&locProp);
      std::__cxx11::string::~string((string *)&mapProp);
    }
    s = s + 1;
  } while( true );
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config,
                               const char** loc, const char** imp,
                               std::string& suffix) const
{
  std::string config_upper;
  if (!desired_config.empty()) {
    config_upper = cmSystemTools::UpperCase(desired_config);
  }

  std::string locPropBase;
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    locPropBase = "IMPORTED_LIBNAME";
  } else if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    locPropBase = "IMPORTED_OBJECTS";
  } else {
    locPropBase = "IMPORTED_LOCATION";
  }

  // Track the configuration-specific property suffix.
  suffix = "_";
  suffix += config_upper;

  std::vector<std::string> mappedConfigs;
  {
    std::string mapProp = "MAP_IMPORTED_CONFIG_";
    mapProp += config_upper;
    if (const char* mapValue = this->GetProperty(mapProp)) {
      cmSystemTools::ExpandListArgument(mapValue, mappedConfigs, true);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // On a DLL platform there may be only IMPORTED_IMPLIB for a shared
  // library or an executable with exports.
  bool allowImp = this->HasImportLibrary();

  // If a mapping was found, check its configurations.
  for (std::vector<std::string>::const_iterator mci = mappedConfigs.begin();
       !*loc && !*imp && mci != mappedConfigs.end(); ++mci) {
    // Look for this configuration.
    if (mci->empty()) {
      // An empty string in the mapping has a special meaning:
      // look up the config-less properties.
      *loc = this->GetProperty(locPropBase);
      if (allowImp) {
        *imp = this->GetProperty("IMPORTED_IMPLIB");
      }
      // If it was found, set the suffix.
      if (*loc || *imp) {
        suffix = "";
      }
    } else {
      std::string mcUpper = cmSystemTools::UpperCase(*mci);
      std::string locProp = locPropBase + "_";
      locProp += mcUpper;
      *loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = "IMPORTED_IMPLIB_";
        impProp += mcUpper;
        *imp = this->GetProperty(impProp);
      }

      // If it was found, use it for all properties below.
      if (*loc || *imp) {
        suffix = "_";
        suffix += mcUpper;
      }
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // then the target location is not found.  The project does not want
  // any other configuration.
  if (!mappedConfigs.empty() && !*loc && !*imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave *loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if (!*loc && !*imp) {
    std::string locProp = locPropBase;
    locProp += suffix;
    *loc = this->GetProperty(locProp);
    if (allowImp) {
      std::string impProp = "IMPORTED_IMPLIB";
      impProp += suffix;
      *imp = this->GetProperty(impProp);
    }
  }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if (!*loc && !*imp) {
    // The suffix computed above is not useful.
    suffix = "";

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    *loc = this->GetProperty(locPropBase);
    if (allowImp) {
      *imp = this->GetProperty("IMPORTED_IMPLIB");
    }
  }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if (!*loc && !*imp) {
    std::vector<std::string> availableConfigs;
    if (const char* iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS")) {
      cmSystemTools::ExpandListArgument(iconfigs, availableConfigs);
    }
    for (std::vector<std::string>::const_iterator aci =
           availableConfigs.begin();
         !*loc && !*imp && aci != availableConfigs.end(); ++aci) {
      suffix = "_";
      suffix += cmSystemTools::UpperCase(*aci);
      std::string locProp = locPropBase;
      locProp += suffix;
      *loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = "IMPORTED_IMPLIB";
        impProp += suffix;
        *imp = this->GetProperty(impProp);
      }
    }
  }
  // If we have not yet found it then the target location is not available.
  if (!*loc && !*imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave *loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  return true;
}